

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::collapse(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *pDVar2
  ;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  char cVar3;
  int item;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar4;
  QWidget *this_02;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  Bucket BVar7;
  QPersistentModelIndex QStack_68;
  QPersistentModelIndex local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) ||
     (this_00 = *(QTreeViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8,
     (index->m).ptr != (this_00->super_QAbstractItemViewPrivate).model)) goto LAB_005a9f55;
  pQVar1 = (index->m).ptr;
  if ((pQVar1 == (QAbstractItemModel *)0x0) ||
     (cVar3 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,index), -1 < cVar3)) {
    local_58.m.ptr = (index->m).ptr;
    local_58.r = index->r;
    local_58.c = index->c;
    local_58.i = index->i;
    pDVar2 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
               **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90);
    if (pDVar2 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                   *)0x0) goto LAB_005a9e1f;
    BVar7 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
            ::findBucket<QtPrivate::QModelIndexWrapper>(pDVar2,(QModelIndexWrapper *)&local_58);
    if ((BVar7.span[BVar7.index] == (Span)0xff) || (*(long *)(BVar7.span + 0x80) == 0))
    goto LAB_005a9e1f;
    QPersistentModelIndex::QPersistentModelIndex(&local_60,index);
    this_01 = (this_00->expandedIndexes).q_hash.d;
    bVar6 = true;
    bVar5 = true;
    if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
    goto LAB_005a9e21;
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
             findNode<QPersistentModelIndex>(this_01,&local_60);
    bVar5 = pNVar4 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
  }
  else {
LAB_005a9e1f:
    bVar5 = false;
LAB_005a9e21:
    bVar6 = bVar5;
    bVar5 = false;
  }
  if (bVar6) {
    QPersistentModelIndex::~QPersistentModelIndex(&local_60);
  }
  if (!bVar5) goto LAB_005a9f55;
  QBasicTimer::stop();
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != true) &&
     (item = QTreeViewPrivate::viewIndex(this_00,index), item != -1)) {
    QTreeViewPrivate::collapse(this_00,item,true);
    if ((this_00->super_QAbstractItemViewPrivate).state != AnimatingState) {
      (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget + 0x268))(this);
      this_02 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::update(this_02);
    }
    goto LAB_005a9f55;
  }
  local_58.m.ptr = (index->m).ptr;
  local_58.r = index->r;
  local_58.c = index->c;
  local_58.i = index->i;
  pDVar2 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
             **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90);
  if (pDVar2 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 *)0x0) {
LAB_005a9ee7:
    bVar6 = false;
  }
  else {
    BVar7 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
            ::findBucket<QtPrivate::QModelIndexWrapper>(pDVar2,(QModelIndexWrapper *)&local_58);
    if (BVar7.span[BVar7.index] == (Span)0xff) goto LAB_005a9ee7;
    bVar6 = *(long *)(BVar7.span + 0x80) != 0;
  }
  if (bVar6) {
    QPersistentModelIndex::QPersistentModelIndex(&QStack_68,index);
    bVar6 = QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                      (&(this_00->expandedIndexes).q_hash,&QStack_68);
    QPersistentModelIndex::~QPersistentModelIndex(&QStack_68);
  }
  else {
    bVar6 = false;
  }
  if (bVar6 != false) {
    local_58.r = 0;
    local_58.c = 0;
    local_58.i = (quintptr)index;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
  }
LAB_005a9f55:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::collapse(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (!d->isIndexExpanded(index))
        return;
    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    d->delayedAutoScroll.stop();

    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just un-store the expanded index, no need to layout.
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
        return;
    }
    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->collapse(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            viewport()->update();
        }
    } else {
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
    }
}